

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

Node * __thiscall spoa::Graph::AddNode(Graph *this,uint32_t code)

{
  Node *this_00;
  size_type sVar1;
  reference this_01;
  pointer pNVar2;
  Node *local_20;
  uint32_t local_14;
  Graph *pGStack_10;
  uint32_t code_local;
  Graph *this_local;
  
  local_14 = code;
  pGStack_10 = this;
  this_00 = (Node *)operator_new(0x50);
  sVar1 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::size(&this->nodes_);
  Node::Node(this_00,(uint32_t)sVar1,local_14);
  local_20 = this_00;
  std::
  vector<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>,std::allocator<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>>>
  ::emplace_back<spoa::Graph::Node*>
            ((vector<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>,std::allocator<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>>>
              *)&this->nodes_,&local_20);
  this_01 = std::
            vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
            ::back(&this->nodes_);
  pNVar2 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::get(this_01)
  ;
  return pNVar2;
}

Assistant:

Graph::Node* Graph::AddNode(std::uint32_t code) {
  nodes_.emplace_back(new Node(nodes_.size(), code));
  return nodes_.back().get();
}